

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

nh_bool get_option_value(win_menu *mdat,wchar_t idx)

{
  undefined8 *puVar1;
  nh_opttype nVar2;
  undefined4 uVar3;
  msgtype_action action;
  nh_autopickup_rules *pnVar4;
  nh_listitem *pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  wchar_t awVar11 [1];
  char cVar12;
  wchar_t wVar13;
  wchar_t wVar14;
  nh_option_desc *pnVar15;
  wchar_t *results;
  long *plVar16;
  void *pvVar17;
  size_t sVar18;
  nh_menuitem_conflict *items;
  nh_menuitem_conflict *pnVar19;
  char *pcVar20;
  nh_menuitem_conflict *pnVar21;
  char *pcVar22;
  char acVar23 [4];
  msgtype_action mVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  undefined8 *puVar28;
  char *pcVar29;
  int iVar30;
  char *pcVar31;
  nh_menuitem *pnVar32;
  nh_menuitem *_item__1;
  ulong uVar33;
  nh_menuitem *_item_;
  ulong uVar34;
  long lVar35;
  int iVar36;
  uint uVar37;
  char *classname;
  long lVar38;
  bool bVar39;
  byte bVar40;
  nh_menuitem_conflict *local_1f10;
  wchar_t selected [1];
  int local_1f00;
  wchar_t selected_1 [1];
  wchar_t selected_4 [1];
  nh_optvalue value;
  int local_1ec4;
  nh_menuitem *_item__2;
  char *local_1eb8;
  ulong local_1eb0;
  char *local_1ea8;
  nh_menuitem *_item__5;
  char *local_1e98;
  char *local_1e90;
  char local_1e84 [4];
  ulong local_1e80;
  long local_1e78;
  char *local_1e70;
  char query [256];
  char local_1d68 [4];
  undefined2 auStack_1d64 [2];
  undefined4 auStack_1d60 [62];
  char query_2 [256];
  char strbuf [256];
  char buf [256];
  
  iVar36 = settings.optstyle;
  bVar40 = 0;
  wVar13 = mdat->items[idx].id;
  iVar30 = wVar13 >> 10;
  if (3 < iVar30 - 1U) {
    return '\0';
  }
  uVar25 = wVar13 & 0x1ff;
  switch(iVar30) {
  case 2:
    break;
  case 3:
    break;
  case 4:
    pnVar15 = curses_options;
    goto LAB_0010f5a6;
  }
  pnVar15 = (nh_option_desc *)nh_get_options();
LAB_0010f5a6:
  value.s = strbuf;
  nVar2 = pnVar15[uVar25].type;
  if (OPTTYPE_MSGTYPE < nVar2) {
    if (nVar2 != 1000) {
      return '\0';
    }
    show_keymap_menu('\0');
    return '\0';
  }
  pnVar15 = pnVar15 + uVar25;
  switch(nVar2) {
  case OPTTYPE_BOOL:
    pnVar19 = (nh_menuitem_conflict *)malloc(0x430);
    pnVar19->id = L'\0';
    pnVar19->role = MI_TEXT;
    pnVar19->accel = '\0';
    pnVar19->group_accel = '\0';
    pnVar19->selected = '\0';
    strcpy(pnVar19->caption,pnVar15->helptxt);
    pnVar19[1].accel = '\0';
    pnVar19[1].group_accel = '\0';
    pnVar19[1].selected = '\0';
    pnVar19[1].id = L'\0';
    pnVar19[1].role = MI_TEXT;
    pnVar19[1].caption[0] = '\0';
    pnVar19[2].id = L'\x01';
    pnVar19[2].role = MI_NORMAL;
    pnVar19[2].accel = 't';
    pnVar19[2].group_accel = '\0';
    pnVar19[2].selected = '\0';
    bVar39 = (pnVar15->value).b == '\0';
    pcVar20 = "true (set)";
    if (bVar39) {
      pcVar20 = "true";
    }
    pcVar22 = "false";
    if (bVar39) {
      pcVar22 = "false (set)";
    }
    strcpy(pnVar19[2].caption,pcVar20);
    pnVar19[3].id = L'\x02';
    pnVar19[3].role = MI_NORMAL;
    pnVar19[3].accel = 'f';
    pnVar19[3].group_accel = '\0';
    pnVar19[3].selected = '\0';
    strcpy(pnVar19[3].caption,pcVar22);
    wVar13 = curses_display_menu(pnVar19,L'\x04',pnVar15->name,L'\x01',(wchar_t *)buf);
    free(pnVar19);
    value.b = (pnVar15->value).b;
    if (wVar13 == L'\x01') {
      value.b = buf._0_4_ == 1;
    }
    break;
  case OPTTYPE_INT:
    sprintf(query,"New value for %s (number from %d to %d)",pnVar15->name,
            (ulong)(uint)(pnVar15->field_4).i.min,(ulong)(uint)(pnVar15->field_4).i.max);
    sprintf(buf,"%d",(ulong)strbuf & 0xffffffff);
    curses_getline(query,buf);
    if (buf[0] == '\x1b') {
      return '\0';
    }
    __isoc99_sscanf(buf,"%d",&value);
    break;
  case OPTTYPE_ENUM:
    iVar30 = 1;
    local_1f10 = (nh_menuitem_conflict *)malloc(0xa78);
    local_1f10->id = L'\0';
    local_1f10->role = MI_TEXT;
    local_1f10->accel = '\0';
    local_1f10->group_accel = '\0';
    local_1f10->selected = '\0';
    strcpy(local_1f10->caption,pnVar15->helptxt);
    local_1f10[1].accel = '\0';
    local_1f10[1].group_accel = '\0';
    local_1f10[1].selected = '\0';
    local_1f10[1].id = L'\0';
    local_1f10[1].role = MI_TEXT;
    local_1f10[1].caption[0] = '\0';
    local_1f00 = 10;
    sVar18 = 8;
    lVar35 = 0x322;
    for (lVar26 = 2; lVar26 + -2 < (long)(pnVar15->field_4).e.numchoices; lVar26 = lVar26 + 1) {
      pnVar5 = (pnVar15->field_4).e.choices;
      pcVar22 = *(char **)((long)pnVar5 + sVar18 * 4 + -0x18);
      pcVar20 = pcVar22;
      if ((pnVar15->value).i == (&pnVar5[-2].id)[sVar18]) {
        pcVar20 = buf;
        snprintf(pcVar20,0x80,"%s (set)",pcVar22);
      }
      if (local_1f00 <= lVar26) {
        local_1f00 = local_1f00 * 2;
        local_1f10 = (nh_menuitem_conflict *)realloc(local_1f10,(long)local_1f00 * 0x10c);
      }
      pcVar22 = local_1f10->caption + lVar35 + -8;
      *(int *)(pcVar22 + -0x10a) = iVar30;
      *(undefined4 *)(pcVar22 + -0x106) = 1;
      *(undefined2 *)(pcVar22 + -2) = MI_TEXT >> 0x10;
      *pcVar22 = '\0';
      strcpy(pcVar22 + -0x102,pcVar20);
      sVar18 = sVar18 + 4;
      lVar35 = lVar35 + 0x10c;
      iVar30 = iVar30 + 1;
    }
    results = (wchar_t *)malloc(sVar18);
    wVar13 = curses_display_menu(local_1f10,(wchar_t)lVar26,pnVar15->name,L'\x01',results);
    free(local_1f10);
    iVar30 = (pnVar15->value).i;
    if (wVar13 == L'\x01') {
      iVar30 = (pnVar15->field_4).e.choices[(long)*results + -1].id;
    }
    value.i = iVar30;
    free(results);
    break;
  case OPTTYPE_STRING:
    sprintf(query,"New value for %s (text)",pnVar15->name);
    curses_getline(query,strbuf);
    if (strbuf[0] == '\x1b') {
      return '\0';
    }
    break;
  case OPTTYPE_AUTOPICKUP_RULES:
    plVar16 = (long *)malloc(0x10);
    *(undefined4 *)(plVar16 + 1) = 0;
    *plVar16 = 0;
    pnVar4 = (pnVar15->value).ar;
    if (pnVar4 == (nh_autopickup_rules *)0x0) {
      iVar36 = 4;
    }
    else {
      iVar36 = pnVar4->num_rules;
      *(int *)(plVar16 + 1) = iVar36;
      pvVar17 = malloc((long)(iVar36 * 0x34));
      *plVar16 = (long)pvVar17;
      memcpy(pvVar17,pnVar4->rules,(long)(iVar36 * 0x34));
      iVar36 = iVar36 + 4;
    }
    pnVar19 = (nh_menuitem_conflict *)malloc((long)iVar36 * 0x10c);
    selected[0] = L'\0';
LAB_0010fadc:
    if (iVar36 < 1) {
      iVar36 = iVar36 * 2;
      pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)iVar36 * 0x10c);
    }
    pnVar19->id = L'\0';
    pnVar19->role = MI_HEADING;
    pnVar19->accel = '\0';
    pnVar19->group_accel = '\0';
    pnVar19->selected = '\0';
    builtin_strncpy(pnVar19->caption,"Pos\tRule\tAction",0x10);
    uVar34 = 0;
    uVar33 = 1;
    while ((long)uVar34 < (long)(int)plVar16[1]) {
      lVar35 = *plVar16;
      lVar38 = uVar34 * 0x34;
      lVar26 = lVar35 + lVar38;
      uVar34 = uVar34 + 1;
      sprintf(local_1d68,"%2d.\tIF ",uVar34 & 0xffffffff);
      cVar12 = *(char *)(lVar35 + lVar38);
      if (cVar12 != '\0') {
        sVar18 = strlen(local_1d68);
        sprintf(local_1d68 + sVar18,"name matches \"%s\"",lVar26);
      }
      if (*(int *)(lVar26 + 0x28) == 0x61) {
        uVar25 = *(uint *)(lVar26 + 0x2c);
        if (uVar25 == 4) {
          if (cVar12 == '\0') {
            sprintf(local_1d68,"%2d.\teverything",uVar34 & 0xffffffff);
          }
        }
        else {
          if (cVar12 != '\0') goto LAB_0010fc7f;
LAB_0010fc9c:
          sVar18 = strlen(local_1d68);
          sprintf(local_1d68 + sVar18,"beatitude is %s",bucnames[uVar25]);
        }
      }
      else {
        lVar38 = 8;
        lVar27 = 0;
        lVar35 = 0;
        while ((lVar27 < (pnVar15->field_4).e.numchoices && (lVar35 == 0))) {
          pnVar5 = (pnVar15->field_4).e.choices;
          if (*(int *)((long)pnVar5 + lVar38 + -8) == *(int *)(lVar26 + 0x28)) {
            lVar35 = *(long *)((long)&pnVar5->id + lVar38);
          }
          else {
            lVar35 = 0;
          }
          lVar27 = lVar27 + 1;
          lVar38 = lVar38 + 0x10;
        }
        if (cVar12 != '\0') {
          sVar18 = strlen(local_1d68);
          builtin_strncpy(local_1d68 + sVar18," AND",4);
          *(undefined2 *)((long)auStack_1d64 + sVar18) = 0x20;
        }
        sVar18 = strlen(local_1d68);
        sprintf(local_1d68 + sVar18,"type is \"%s\"",lVar35);
        uVar25 = *(uint *)(lVar26 + 0x2c);
        if (uVar25 != 4) {
LAB_0010fc7f:
          sVar18 = strlen(local_1d68);
          builtin_strncpy(local_1d68 + sVar18," AND",4);
          *(undefined2 *)((long)auStack_1d64 + sVar18) = 0x20;
          goto LAB_0010fc9c;
        }
      }
      iVar30 = *(int *)(lVar26 + 0x30);
      sVar18 = strlen(local_1d68);
      if (iVar30 == 0) {
        builtin_strncpy(local_1d68 + sVar18,":\t< GRAB",8);
        *(undefined1 *)((long)auStack_1d60 + sVar18) = 0;
      }
      else {
        builtin_strncpy(local_1d68 + sVar18,":\t  LEAV",8);
        *(undefined4 *)((long)auStack_1d60 + sVar18) = 0x3e2045;
      }
      if ((long)iVar36 <= (long)uVar33) {
        iVar36 = iVar36 * 2;
        pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)iVar36 * 0x10c);
      }
      pnVar21 = pnVar19 + uVar33;
      pnVar21->id = (wchar_t)uVar34;
      pnVar21->role = MI_NORMAL;
      pnVar21->accel = '\0';
      pnVar21->group_accel = '\0';
      pnVar21->selected = '\0';
      strcpy(pnVar21->caption,local_1d68);
      uVar33 = uVar33 + 1;
    }
    iVar30 = (int)uVar33;
    if (iVar36 <= iVar30) {
      iVar36 = iVar36 * 2;
      pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)iVar36 * 0x10c);
    }
    uVar33 = uVar33 & 0xffffffff;
    pnVar19[uVar33].accel = '\0';
    pnVar19[uVar33].group_accel = '\0';
    pnVar19[uVar33].selected = '\0';
    pnVar19[uVar33].id = L'\0';
    pnVar19[uVar33].role = MI_TEXT;
    uVar25 = iVar30 + 1;
    pnVar19[uVar33].caption[0] = '\0';
    if (iVar36 <= (int)uVar25) {
      iVar36 = iVar36 * 2;
      pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)iVar36 * 0x10c);
    }
    pnVar19[uVar25].id = L'\xffffffff';
    pnVar19[uVar25].role = MI_NORMAL;
    pnVar19[uVar25].accel = '!';
    pnVar19[uVar25].group_accel = '\0';
    pnVar19[uVar25].selected = '\0';
    builtin_strncpy(pnVar19[uVar25].caption,"add a ne",8);
    builtin_strncpy(pnVar19[uVar25].caption + 7,"ew rule",8);
    uVar25 = iVar30 + 2;
    if (iVar36 <= (int)uVar25) {
      iVar36 = iVar36 * 2;
      pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)iVar36 * 0x10c);
    }
    pnVar19[uVar25].id = L'\xfffffffe';
    pnVar19[uVar25].role = MI_NORMAL;
    pnVar19[uVar25].accel = '?';
    pnVar19[uVar25].group_accel = '\0';
    pnVar19[uVar25].selected = '\0';
    pnVar19[uVar25].caption[4] = '\0';
    builtin_strncpy(pnVar19[uVar25].caption,"help",4);
    local_1ec4 = iVar36;
    if (selected[0] == L'\xffffffff') {
      wVar13 = curses_display_menu_bottom
                         (pnVar19,iVar30 + L'\x03',"Autopickup rules:",L'\x01',selected);
    }
    else {
      wVar13 = curses_display_menu(pnVar19,iVar30 + L'\x03',"Autopickup rules:",L'\x01',selected);
    }
    if (L'\0' < wVar13) {
      uVar33 = (ulong)selected[0];
      if (uVar33 != 0xfffffffffffffffe) {
        if (selected[0] == L'\xffffffff') {
          uVar25 = *(uint *)(plVar16 + 1);
          uVar37 = uVar25 + 1;
          uVar33 = (ulong)uVar37;
          *(uint *)(plVar16 + 1) = uVar37;
          pvVar17 = realloc((void *)*plVar16,(long)(int)(uVar37 * 0x34));
          *plVar16 = (long)pvVar17;
          local_1e80 = (ulong)(int)uVar25;
          lVar26 = local_1e80 * 0x34;
          *(undefined1 *)((long)pvVar17 + lVar26) = 0;
          *(undefined8 *)((long)pvVar17 + lVar26 + 0x28) = 0x400000061;
          *(undefined4 *)((long)pvVar17 + lVar26 + 0x30) = 0;
          local_1eb0 = (ulong)uVar25;
        }
        else {
          local_1e80 = uVar33 - 1;
          pvVar17 = (void *)*plVar16;
          local_1eb0 = local_1e80 & 0xffffffff;
        }
        local_1e78 = local_1e80 * 0x34;
        pcVar20 = (char *)((long)pvVar17 + local_1e78);
        pnVar21 = (nh_menuitem_conflict *)malloc(0x754);
        local_1e90 = pnVar21->caption;
        local_1e98 = pnVar21[1].caption;
        _item__5 = (nh_menuitem *)pnVar21[2].caption;
        local_1ea8 = pnVar21[3].caption;
        local_1eb8 = pnVar21[4].caption;
        _item__2 = (nh_menuitem *)(pnVar21 + 5);
        local_1e70 = pnVar21[6].caption;
        do {
          sprintf(query_2,"rule position:\t[%d]",uVar33 & 0xffffffff);
          pnVar21->id = L'\x01';
          pnVar21->role = MI_NORMAL;
          pnVar21->accel = '\0';
          pnVar21->group_accel = '\0';
          pnVar21->selected = '\0';
          strcpy(local_1e90,query_2);
          sprintf(query_2,"name pattern:\t[%s]",pcVar20);
          pnVar21[1].id = L'\x02';
          pnVar21[1].role = MI_NORMAL;
          pnVar21[1].accel = '\0';
          pnVar21[1].group_accel = '\0';
          pnVar21[1].selected = '\0';
          strcpy(local_1e98,query_2);
          lVar35 = 8;
          lVar38 = 0;
          lVar26 = 0;
          while ((lVar38 < (pnVar15->field_4).e.numchoices && (lVar26 == 0))) {
            pnVar5 = (pnVar15->field_4).e.choices;
            if (*(int *)((long)pnVar5 + lVar35 + -8) == *(int *)(pcVar20 + 0x28)) {
              lVar26 = *(long *)((long)&pnVar5->id + lVar35);
            }
            else {
              lVar26 = 0;
            }
            lVar38 = lVar38 + 1;
            lVar35 = lVar35 + 0x10;
          }
          sprintf(query_2,"object type:\t[%s]");
          pnVar21[2].id = L'\x03';
          pnVar21[2].role = MI_NORMAL;
          pnVar21[2].accel = '\0';
          pnVar21[2].group_accel = '\0';
          pnVar21[2].selected = '\0';
          strcpy((char *)_item__5,query_2);
          sprintf(query_2,"beatitude:\t[%s]",bucnames[*(uint *)(pcVar20 + 0x2c)]);
          pnVar21[3].id = L'\x04';
          pnVar21[3].role = MI_NORMAL;
          pnVar21[3].accel = '\0';
          pnVar21[3].group_accel = '\0';
          pnVar21[3].selected = '\0';
          strcpy(local_1ea8,query_2);
          pcVar22 = "LEAVE";
          if (*(int *)(pcVar20 + 0x30) == 0) {
            pcVar22 = "GRAB";
          }
          sprintf(query_2,"action:\t[%s]",pcVar22);
          pnVar21[4].id = L'\x05';
          pnVar21[4].role = MI_NORMAL;
          pnVar21[4].accel = '\0';
          pnVar21[4].group_accel = '\0';
          pnVar21[4].selected = '\0';
          strcpy(local_1eb8,query_2);
          pnVar21[5].accel = '\0';
          pnVar21[5].group_accel = '\0';
          pnVar21[5].selected = '\0';
          _item__2->id = 0;
          _item__2->role = MI_TEXT;
          _item__2->caption[0] = '\0';
          pnVar21[6].id = L'\x06';
          pnVar21[6].role = MI_NORMAL;
          pnVar21[6].accel = 'x';
          pnVar21[6].group_accel = '\0';
          pnVar21[6].selected = '\0';
          builtin_strncpy(local_1e70,"delete this rule",0x11);
          wVar13 = curses_display_menu(pnVar21,L'\a',"Edit rule:",L'\x01',selected_1);
          if (wVar13 < L'\x01') goto LAB_001105c0;
          switch(selected_1[0]) {
          case L'\x01':
            uVar25 = *(uint *)(plVar16 + 1);
            sprintf(query,"New rule position: (1 - %d), currently: %d",(ulong)uVar25,
                    uVar33 & 0xffffffff);
            query_2[0] = '\0';
            curses_getline(query,query_2);
            if ((query_2[0] != '\0') && (query_2[0] != '\x1b')) {
              uVar37 = atoi(query_2);
              if ((int)uVar37 < 1 || (int)uVar25 < (int)uVar37) {
                curses_msgwin("Invalid rule position.");
              }
              else {
                uVar25 = uVar37 - 1;
                if (uVar25 != (uint)local_1eb0) {
                  lVar26 = *plVar16;
                  lVar35 = local_1e80 * 0x34;
                  buf._48_4_ = *(undefined4 *)(lVar26 + 0x30 + lVar35);
                  buf._0_8_ = *(undefined8 *)(lVar26 + lVar35);
                  buf._8_8_ = *(undefined8 *)((char *)(lVar26 + lVar35) + 8);
                  pcVar20 = (char *)(lVar26 + 0x10 + lVar35);
                  buf._16_8_ = *(undefined8 *)pcVar20;
                  buf._24_8_ = *(undefined8 *)(pcVar20 + 8);
                  pcVar20 = (char *)(lVar26 + 0x20 + lVar35);
                  buf._32_8_ = *(undefined8 *)pcVar20;
                  buf._40_8_ = *(undefined8 *)(pcVar20 + 8);
                  if ((int)(uint)local_1eb0 < (int)uVar25) {
                    puVar28 = (undefined8 *)(lVar35 + lVar26);
                    lVar35 = uVar25 - local_1e80;
                    while (bVar39 = lVar35 != 0, lVar35 = lVar35 + -1, bVar39) {
                      *(undefined4 *)(puVar28 + 6) = *(undefined4 *)((long)puVar28 + 100);
                      puVar28[4] = *(undefined8 *)((long)puVar28 + 0x54);
                      puVar28[5] = *(undefined8 *)((long)puVar28 + 0x5c);
                      puVar28[2] = *(undefined8 *)((long)puVar28 + 0x44);
                      puVar28[3] = *(undefined8 *)((long)puVar28 + 0x4c);
                      *puVar28 = *(undefined8 *)((long)puVar28 + 0x34);
                      puVar28[1] = *(undefined8 *)((long)puVar28 + 0x3c);
                      puVar28 = (undefined8 *)((long)puVar28 + 0x34);
                    }
                  }
                  else {
                    puVar28 = (undefined8 *)(lVar35 + lVar26);
                    for (uVar33 = local_1e80; (long)(ulong)uVar37 <= (long)uVar33;
                        uVar33 = uVar33 - 1) {
                      *(undefined4 *)(puVar28 + 6) = *(undefined4 *)((long)puVar28 + -4);
                      puVar28[4] = *(undefined8 *)((long)puVar28 + -0x14);
                      puVar28[5] = *(undefined8 *)((long)puVar28 + -0xc);
                      puVar28[2] = *(undefined8 *)((long)puVar28 + -0x24);
                      puVar28[3] = *(undefined8 *)((long)puVar28 + -0x1c);
                      *puVar28 = *(undefined8 *)((long)puVar28 + -0x34);
                      puVar28[1] = *(undefined8 *)((long)puVar28 + -0x2c);
                      puVar28 = (undefined8 *)((long)puVar28 + -0x34);
                    }
                  }
                  lVar35 = (ulong)uVar25 * 0x34;
                  *(undefined4 *)(lVar26 + 0x30 + lVar35) = buf._48_4_;
                  pcVar20 = (char *)(lVar26 + 0x20 + lVar35);
                  *(undefined8 *)pcVar20 = buf._32_8_;
                  *(undefined8 *)(pcVar20 + 8) = buf._40_8_;
                  pcVar20 = (char *)(lVar26 + 0x10 + lVar35);
                  *(undefined8 *)pcVar20 = buf._16_8_;
                  *(undefined8 *)(pcVar20 + 8) = buf._24_8_;
                  *(undefined8 *)(lVar26 + lVar35) = buf._0_8_;
                  *(undefined8 *)((char *)(lVar26 + lVar35) + 8) = buf._8_8_;
                  goto LAB_001105c0;
                }
              }
            }
            break;
          case L'\x02':
            builtin_strncpy(query + 0x20,"everything):",0xd);
            builtin_strncpy(query + 0x10," (empty matches ",0x10);
            builtin_strncpy(query,"New name pattern",0x10);
            query_2[0] = '\0';
            curses_getline(query,query_2);
            if (query_2[0] != '\x1b') {
              strncpy(pcVar20,query_2,0x28);
            }
            pcVar20[0x27] = '\0';
            break;
          case L'\x03':
            local_1e84 = *(char (*) [4])(pcVar20 + 0x28);
            iVar36 = (pnVar15->field_4).e.numchoices;
            uVar34 = (ulong)iVar36;
            items = (nh_menuitem_conflict *)malloc(uVar34 * 0x10c);
            lVar38 = 0x10a;
            lVar26 = 8;
            for (lVar35 = 0; lVar35 < (int)uVar34; lVar35 = lVar35 + 1) {
              if (iVar36 <= lVar35) {
                iVar36 = iVar36 * 2;
                items = (nh_menuitem_conflict *)realloc(items,(long)iVar36 * 0x10c);
              }
              pnVar5 = (pnVar15->field_4).e.choices;
              uVar3 = *(undefined4 *)((long)pnVar5 + lVar26 + -8);
              *(undefined4 *)((long)items + lVar38 + -0x10a) = uVar3;
              *(undefined4 *)((long)items + lVar38 + -0x106) = 1;
              items->caption[lVar38 + -10] = (char)uVar3;
              (items->caption + lVar38 + -9)[0] = '\0';
              (items->caption + lVar38 + -9)[1] = '\0';
              strcpy((char *)((long)items + lVar38 + -0x102),*(char **)((long)&pnVar5->id + lVar26))
              ;
              uVar34 = (ulong)(uint)(pnVar15->field_4).e.numchoices;
              lVar26 = lVar26 + 0x10;
              lVar38 = lVar38 + 0x10c;
            }
            wVar13 = curses_display_menu(items,(wchar_t)lVar35,"Object class match:",L'\x01',
                                         (wchar_t *)buf);
            free(items);
            acVar23 = local_1e84;
            if (L'\0' < wVar13) {
              acVar23 = (char  [4])buf._0_4_;
            }
            *(char (*) [4])(pcVar20 + 0x28) = acVar23;
            break;
          case L'\x04':
            iVar36 = *(int *)(pcVar20 + 0x2c);
            memcpy((nh_menuitem_conflict *)buf,&DAT_0011b800,0x53c);
            wVar13 = curses_display_menu((nh_menuitem_conflict *)buf,L'\x05',"Beatitude match:",
                                         L'\x01',selected_4);
            iVar30 = selected_4[0] + L'\xffffffff';
            if (wVar13 < L'\x01') {
              iVar30 = iVar36;
            }
            *(int *)(pcVar20 + 0x2c) = iVar30;
            break;
          case L'\x05':
            if (*(int *)(pcVar20 + 0x30) == 0) {
              pcVar20[0x30] = '\x01';
              pcVar20[0x31] = '\0';
              pcVar20[0x32] = '\0';
              pcVar20[0x33] = '\0';
            }
            else {
              pcVar20[0x30] = '\0';
              pcVar20[0x31] = '\0';
              pcVar20[0x32] = '\0';
              pcVar20[0x33] = '\0';
            }
            break;
          case L'\x06':
            goto switchD_0011025d_caseD_6;
          }
        } while( true );
      }
      memcpy((nh_menuitem_conflict *)buf,&DAT_00119dd0,0x1a2c);
      curses_display_menu((nh_menuitem_conflict *)buf,L'\x19',"Autopickup rules help:",L'\0',
                          (wchar_t *)0x0);
      iVar36 = local_1ec4;
      goto LAB_0010fadc;
    }
    nh_set_option(pnVar15->name,plVar16,0);
    free((void *)*plVar16);
    free(plVar16);
    goto LAB_00110eb0;
  case OPTTYPE_MSGTYPE:
    plVar16 = (long *)malloc(0x10);
    pnVar4 = (pnVar15->value).ar;
    if (pnVar4 == (nh_autopickup_rules *)0x0) {
      *(undefined4 *)(plVar16 + 1) = 0;
      local_1f10._0_4_ = 4;
      *plVar16 = 0;
    }
    else {
      local_1f10._0_4_ = pnVar4->num_rules;
      *(int *)(plVar16 + 1) = (int)local_1f10;
      pvVar17 = malloc((ulong)(uint)((int)local_1f10 * 0x7c));
      *plVar16 = (long)pvVar17;
      memcpy(pvVar17,pnVar4->rules,(ulong)(uint)((int)local_1f10 * 0x7c));
      local_1f10._0_4_ = (int)local_1f10 + 4;
    }
    pnVar19 = (nh_menuitem_conflict *)malloc((long)(int)local_1f10 * 0x10c);
    selected[0] = L'\0';
    while( true ) {
      if ((int)local_1f10 < 1) {
        local_1f10._0_4_ = (int)local_1f10 * 2;
        pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)(int)local_1f10 * 0x10c);
      }
      pnVar19->id = L'\0';
      pnVar19->role = MI_HEADING;
      pnVar19->accel = '\0';
      pnVar19->group_accel = '\0';
      pnVar19->selected = '\0';
      builtin_strncpy(pnVar19->caption,"Pos\tAction\tPattern",0x13);
      lVar35 = 0;
      lVar26 = 0;
      uVar33 = 0;
      while ((long)uVar33 < (long)(int)plVar16[1]) {
        uVar33 = uVar33 + 1;
        lVar38 = *plVar16;
        pcVar20 = msgtype_action_string(*(msgtype_action *)(lVar38 + 0x78 + lVar35));
        sprintf(buf,"%2d.\t%s\t%s",uVar33 & 0xffffffff,pcVar20,lVar38 + lVar35);
        if ((long)(int)local_1f10 <= (long)uVar33) {
          local_1f10._0_4_ = (int)local_1f10 * 2;
          pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)(int)local_1f10 * 0x10c);
        }
        *(int *)(pnVar19[1].caption + lVar26 + -8) = (int)uVar33;
        pcVar20 = pnVar19[1].caption + lVar26 + -4;
        pcVar20[0] = '\x01';
        pcVar20[1] = '\0';
        pcVar20[2] = '\0';
        pcVar20[3] = '\0';
        *(undefined2 *)(&pnVar19[1].accel + lVar26) = 0;
        (&pnVar19[1].selected)[lVar26] = '\0';
        strcpy(pnVar19[1].caption + lVar26,buf);
        lVar26 = lVar26 + 0x10c;
        lVar35 = lVar35 + 0x7c;
      }
      iVar36 = (int)uVar33;
      if ((int)local_1f10 <= iVar36 + 1) {
        local_1f10._0_4_ = (int)local_1f10 * 2;
        pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)(int)local_1f10 * 0x10c);
      }
      *(undefined2 *)(&pnVar19[1].accel + lVar26) = 0;
      (&pnVar19[1].selected)[lVar26] = '\0';
      pcVar20 = pnVar19[1].caption + lVar26 + -8;
      pcVar20[0] = '\0';
      pcVar20[1] = '\0';
      pcVar20[2] = '\0';
      pcVar20[3] = '\0';
      pcVar20[4] = '\0';
      pcVar20[5] = '\0';
      pcVar20[6] = '\0';
      pcVar20[7] = '\0';
      pnVar19[1].caption[lVar26] = '\0';
      if ((int)local_1f10 <= iVar36 + 2) {
        local_1f10._0_4_ = (int)local_1f10 * 2;
        pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)(int)local_1f10 * 0x10c);
      }
      pcVar20 = pnVar19[2].caption + lVar26 + -8;
      pcVar20[0] = -1;
      pcVar20[1] = -1;
      pcVar20[2] = -1;
      pcVar20[3] = -1;
      pcVar20[4] = '\x01';
      pcVar20[5] = '\0';
      pcVar20[6] = '\0';
      pcVar20[7] = '\0';
      *(undefined2 *)(&pnVar19[2].accel + lVar26) = 0x2b;
      (&pnVar19[2].selected)[lVar26] = '\0';
      builtin_strncpy(pnVar19[2].caption + lVar26,"add new ",8);
      builtin_strncpy(pnVar19[2].caption + lVar26 + 6,"w match",8);
      if ((int)local_1f10 <= iVar36 + 3) {
        local_1f10._0_4_ = (int)local_1f10 * 2;
        pnVar19 = (nh_menuitem_conflict *)realloc(pnVar19,(long)(int)local_1f10 * 0x10c);
      }
      pcVar20 = pnVar19[3].caption + lVar26 + -8;
      pcVar20[0] = -2;
      pcVar20[1] = -1;
      pcVar20[2] = -1;
      pcVar20[3] = -1;
      pcVar20[4] = '\x01';
      pcVar20[5] = '\0';
      pcVar20[6] = '\0';
      pcVar20[7] = '\0';
      *(undefined2 *)(&pnVar19[3].accel + lVar26) = 0x3f;
      (&pnVar19[3].selected)[lVar26] = '\0';
      pnVar19[3].caption[lVar26 + 4] = '\0';
      builtin_strncpy(pnVar19[3].caption + lVar26,"help",4);
      if (selected[0] == L'\xffffffff') {
        wVar13 = curses_display_menu_bottom
                           (pnVar19,iVar36 + L'\x04',"Message types:",L'\x01',selected);
      }
      else {
        wVar13 = curses_display_menu(pnVar19,iVar36 + L'\x04',"Message types:",L'\x01',selected);
      }
      awVar11[0] = selected[0];
      if (wVar13 < L'\x01') break;
      uVar33 = (ulong)(uint)selected[0];
      if (selected[0] == L'\xffffffff') {
        iVar36 = (int)plVar16[1];
        if ((long)iVar36 < 1000) {
          *(int *)(plVar16 + 1) = iVar36 + 1;
          pvVar17 = realloc((void *)*plVar16,(ulong)(uint)((iVar36 + 1) * 0x7c));
          *plVar16 = (long)pvVar17;
          lVar26 = (long)iVar36 * 0x7c;
          *(undefined1 *)((long)pvVar17 + lVar26) = 0;
          *(undefined4 *)((long)pvVar17 + lVar26 + 0x78) = 0;
        }
        else {
          curses_msgwin("Maximum number of rules reached.");
        }
      }
      else if (selected[0] == L'\xfffffffe') {
        memcpy((nh_menuitem_conflict *)buf,&DAT_0011bd40,0x10c0);
        curses_display_menu((nh_menuitem_conflict *)buf,L'\x10',"Message types help:",L'\0',
                            (wchar_t *)0x0);
      }
      else {
        local_1eb8 = (char *)*plVar16;
        _item__2 = (nh_menuitem *)(long)(selected[0] + L'\xffffffff');
        pcVar20 = local_1eb8 + (long)_item__2 * 0x7c;
        pnVar21 = (nh_menuitem_conflict *)malloc(0x53c);
        local_1e90 = pnVar21[1].caption;
        local_1e98 = pnVar21[2].caption;
        _item__5 = (nh_menuitem *)(pnVar21 + 3);
        local_1ea8 = pnVar21[4].caption;
LAB_00110a13:
        sprintf(query,"Position:\t[%d]",uVar33);
        pnVar21->id = L'\x01';
        pnVar21->role = MI_NORMAL;
        pnVar21->accel = '\0';
        pnVar21->group_accel = '\0';
        pnVar21->selected = '\0';
        strcpy(pnVar21->caption,query);
        pcVar22 = msgtype_action_string(*(msgtype_action *)(pcVar20 + 0x78));
        sprintf(query,"Action:\t[%s]",pcVar22);
        pnVar21[1].id = L'\x02';
        pnVar21[1].role = MI_NORMAL;
        pnVar21[1].accel = '\0';
        pnVar21[1].group_accel = '\0';
        pnVar21[1].selected = '\0';
        strcpy(local_1e90,query);
        sprintf(query,"Pattern:\t[%s]",pcVar20);
        pnVar21[2].id = L'\x03';
        pnVar21[2].role = MI_NORMAL;
        pnVar21[2].accel = '\0';
        pnVar21[2].group_accel = '\0';
        pnVar21[2].selected = '\0';
        strcpy(local_1e98,query);
        pnVar21[3].accel = '\0';
        pnVar21[3].group_accel = '\0';
        pnVar21[3].selected = '\0';
        _item__5->id = 0;
        _item__5->role = MI_TEXT;
        _item__5->caption[0] = '\0';
        pnVar21[4].id = L'\x04';
        pnVar21[4].role = MI_NORMAL;
        pnVar21[4].accel = '!';
        pnVar21[4].group_accel = '\0';
        pnVar21[4].selected = '\0';
        builtin_strncpy(local_1ea8,"Delete this match",0x12);
        wVar13 = curses_display_menu(pnVar21,L'\x05',"Edit match:",L'\x01',selected_1);
        if (wVar13 < L'\x01') goto LAB_00110e2a;
        switch(selected_1[0]) {
        case L'\x01':
          wVar13 = *(wchar_t *)(plVar16 + 1);
          sprintf(query_2,"New match position: (1 - %d, currently %d)",(ulong)(uint)wVar13,uVar33);
          query._0_8_ = query._0_8_ & 0xffffffffffffff00;
          curses_getline(query_2,query);
          if ((query[0] == '\0') || (query[0] == '\x1b')) goto LAB_00110a13;
          wVar14 = atoi(query);
          if (wVar14 < L'\x01' || wVar13 < wVar14) {
            pcVar22 = "Invalid match position.";
            goto LAB_00110d1a;
          }
          if (wVar14 == awVar11[0]) goto LAB_00110a13;
          pcVar22 = pcVar20;
          pcVar29 = buf;
          for (lVar26 = 0x1f; lVar26 != 0; lVar26 = lVar26 + -1) {
            *(undefined4 *)pcVar29 = *(undefined4 *)pcVar22;
            pcVar22 = pcVar22 + (ulong)bVar40 * -8 + 4;
            pcVar29 = pcVar29 + (ulong)bVar40 * -8 + 4;
          }
          pnVar32 = _item__2;
          if (awVar11[0] < wVar14) {
            while ((long)pnVar32 < (long)(ulong)(uint)(wVar14 + L'\xffffffff')) {
              pnVar32 = (nh_menuitem *)((long)&pnVar32->id + 1);
              pcVar22 = pcVar20 + 0x7c;
              pcVar29 = pcVar22;
              pcVar31 = pcVar20;
              for (lVar26 = 0x1f; pcVar20 = pcVar22, lVar26 != 0; lVar26 = lVar26 + -1) {
                *(undefined4 *)pcVar31 = *(undefined4 *)pcVar29;
                pcVar29 = pcVar29 + (ulong)bVar40 * -8 + 4;
                pcVar31 = pcVar31 + (ulong)bVar40 * -8 + 4;
              }
            }
          }
          else {
            for (; (long)(ulong)(uint)wVar14 <= (long)pnVar32;
                pnVar32 = (nh_menuitem *)&pnVar32[-1].field_0x10b) {
              pcVar22 = pcVar20 + -0x7c;
              pcVar29 = pcVar20;
              for (lVar26 = 0x1f; lVar26 != 0; lVar26 = lVar26 + -1) {
                *(undefined4 *)pcVar29 = *(undefined4 *)pcVar22;
                pcVar22 = pcVar22 + (ulong)bVar40 * -8 + 4;
                pcVar29 = pcVar29 + (ulong)bVar40 * -8 + 4;
              }
              pcVar20 = pcVar20 + -0x7c;
            }
          }
          pcVar20 = buf;
          pcVar22 = local_1eb8 + (ulong)(uint)(wVar14 + L'\xffffffff') * 0x7c;
          for (lVar26 = 0x1f; lVar26 != 0; lVar26 = lVar26 + -1) {
            *(undefined4 *)pcVar22 = *(undefined4 *)pcVar20;
            pcVar20 = pcVar20 + (ulong)bVar40 * -8 + 4;
            pcVar22 = pcVar22 + (ulong)bVar40 * -8 + 4;
          }
LAB_00110e2a:
          free(pnVar21);
          break;
        case L'\x02':
          action = *(msgtype_action *)(pcVar20 + 0x78);
          memcpy((nh_menuitem_conflict *)buf,&DAT_0011ce00,0x430);
          pcVar22 = msgtype_action_string(action);
          sprintf(local_1d68,"Message type action: (currently %s)",pcVar22);
          wVar13 = curses_display_menu((nh_menuitem_conflict *)buf,L'\x04',local_1d68,L'\x01',
                                       selected_4);
          mVar24 = selected_4[0] + L'\xffffffff';
          if (wVar13 < L'\x01') {
            mVar24 = action;
          }
          *(msgtype_action *)(pcVar20 + 0x78) = mVar24;
          goto LAB_00110a13;
        case L'\x03':
          snprintf(query_2,0x100,"New match pattern: (currently \"%s\")",pcVar20);
          query._0_8_ = query._0_8_ & 0xffffffffffffff00;
          curses_getline(query_2,query);
          if (query[0] != '\x1b') {
            for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 1) {
              cVar12 = query[lVar26];
              if (((cVar12 == '\"') || (cVar12 == '|')) || (cVar12 == ';')) {
                query[lVar26] = '?';
              }
            }
            strncpy(pcVar20,query,0x78);
          }
          pcVar20[0x77] = '\0';
          goto LAB_00110a13;
        case L'\x04':
          lVar26 = (long)(int)plVar16[1] + -1;
          pnVar32 = _item__2;
          while ((long)pnVar32 < lVar26) {
            pnVar32 = (nh_menuitem *)((long)&pnVar32->id + 1);
            pcVar22 = pcVar20 + 0x7c;
            pcVar29 = pcVar22;
            pcVar31 = pcVar20;
            for (lVar35 = 0x1f; pcVar20 = pcVar22, lVar35 != 0; lVar35 = lVar35 + -1) {
              *(undefined4 *)pcVar31 = *(undefined4 *)pcVar29;
              pcVar29 = pcVar29 + (ulong)bVar40 * -8 + 4;
              pcVar31 = pcVar31 + (ulong)bVar40 * -8 + 4;
            }
          }
          *(int *)(plVar16 + 1) = (int)lVar26;
          pvVar17 = realloc(local_1eb8,lVar26 * 0x7c);
          *plVar16 = (long)pvVar17;
          goto LAB_00110e2a;
        default:
          pcVar22 = "Invalid msgtype match menu choice.";
LAB_00110d1a:
          curses_msgwin(pcVar22);
          goto LAB_00110a13;
        }
      }
    }
    nh_set_option(pnVar15->name,plVar16,0);
    free((void *)*plVar16);
    free(plVar16);
LAB_00110eb0:
    free(pnVar19);
    return '\0';
  }
  cVar12 = nh_set_option(pnVar15->name,value.s,0);
  if (cVar12 == '\0') {
    sprintf(strbuf,"new value for %s rejected",pnVar15->name);
    curses_msgwin(strbuf);
  }
  else {
    print_option_string(pnVar15,mdat->items[idx].caption);
  }
  return settings.optstyle != iVar36;
switchD_0011025d_caseD_6:
  lVar35 = (long)(int)plVar16[1] + -1;
  lVar26 = local_1e78;
  for (uVar33 = local_1e80; (long)uVar33 < lVar35; uVar33 = uVar33 + 1) {
    lVar38 = *plVar16;
    *(undefined4 *)(lVar38 + 0x30 + lVar26) = *(undefined4 *)(lVar38 + 100 + lVar26);
    puVar28 = (undefined8 *)(lVar38 + 0x34 + lVar26);
    uVar6 = *puVar28;
    uVar7 = puVar28[1];
    puVar28 = (undefined8 *)(lVar38 + 0x44 + lVar26);
    uVar8 = *puVar28;
    uVar9 = puVar28[1];
    puVar28 = (undefined8 *)(lVar38 + 0x54 + lVar26);
    uVar10 = puVar28[1];
    puVar1 = (undefined8 *)(lVar38 + 0x20 + lVar26);
    *puVar1 = *puVar28;
    puVar1[1] = uVar10;
    puVar28 = (undefined8 *)(lVar38 + 0x10 + lVar26);
    *puVar28 = uVar8;
    puVar28[1] = uVar9;
    *(undefined8 *)(lVar38 + lVar26) = uVar6;
    ((undefined8 *)(lVar38 + lVar26))[1] = uVar7;
    lVar26 = lVar26 + 0x34;
  }
  *(int *)(plVar16 + 1) = (int)lVar35;
  pvVar17 = realloc((void *)*plVar16,lVar35 * 0x34);
  *plVar16 = (long)pvVar17;
LAB_001105c0:
  free(pnVar21);
  iVar36 = local_1ec4;
  goto LAB_0010fadc;
}

Assistant:

static nh_bool get_option_value(struct win_menu *mdat, int idx)
{
    char buf[BUFSZ], query[BUFSZ];
    union nh_optvalue value;
    struct nh_option_desc *option, *optlist;
    int listid = mdat->items[idx].id >> 10;
    int id = mdat->items[idx].id & 0x1ff;
    char strbuf[BUFSZ];
    int prev_optstyle = settings.optstyle;
    
    switch (listid) {
	case ACT_BIRTH_OPTS:
	    optlist = nh_get_options(ACTIVE_BIRTH_OPTIONS); break;
	case CUR_BIRTH_OPTS:
	    optlist = nh_get_options(CURRENT_BIRTH_OPTIONS); break;
	case GAME_OPTS:
	    optlist = nh_get_options(GAME_OPTIONS); break;
	case UI_OPTS:
	    optlist = curses_options; break;
	    
	default:
	    return FALSE;
    }
    
    option = &optlist[id];
    value.s = strbuf;
    
    switch ((int)option->type) {
	case OPTTYPE_BOOL:
	    select_boolean_value(&value, option);
	    break;
	    
	case OPTTYPE_INT:
	    sprintf(query, "New value for %s (number from %d to %d)",
		    option->name, option->i.min, option->i.max);
	    sprintf(buf, "%d", value.i);
	    curses_getline(query, buf);
	    if (buf[0] == '\033')
		return FALSE;
	    sscanf(buf, "%d", &value.i);
	    break;
	    
	case OPTTYPE_ENUM:
	    select_enum_value(&value, option);
	    break;
	    
	case OPTTYPE_STRING:
	    sprintf(query, "New value for %s (text)", option->name);
	    curses_getline(query, value.s);
	    if (value.s[0] == '\033')
		return FALSE;
	    break;
	    
	case OPTTYPE_AUTOPICKUP_RULES:
	    show_autopickup_menu(option);
	    return FALSE;
	    
	case OPTTYPE_MSGTYPE:
	    show_msgtype_menu(option);
	    return FALSE;
	    
	case OPTTYPE_KEYMAP:
	    show_keymap_menu(FALSE);
	    return FALSE;
	    
	default:
	    return FALSE;
    }
    
    if (!nh_set_option(option->name, value, FALSE)) {
	sprintf(strbuf, "new value for %s rejected", option->name);
	curses_msgwin(strbuf);
    } else
	print_option_string(option, mdat->items[idx].caption);
    
    /* special case: directly redo option menu appearance */
    if (settings.optstyle != prev_optstyle)
	return TRUE;
    
    return FALSE;
}